

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O3

void __thiscall CEExecOptions::~CEExecOptions(CEExecOptions *this)

{
  ~CEExecOptions(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~CEExecOptions() {}